

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.h
# Opt level: O0

Data * __thiscall
Js::StringBuilder<Memory::ArenaAllocator>::NewSingleChunk
          (StringBuilder<Memory::ArenaAllocator> *this,charcount_t *pBufLengthRequested)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  Data *pDVar5;
  TrackAllocData local_68;
  Data *newChunk;
  ulong uStack_30;
  charcount_t newLength;
  size_t size_t_newLength;
  size_t allocation;
  charcount_t *pcStack_18;
  charcount_t alloc32;
  charcount_t *pBufLengthRequested_local;
  StringBuilder<Memory::ArenaAllocator> *this_local;
  
  pcStack_18 = pBufLengthRequested;
  pBufLengthRequested_local = (charcount_t *)this;
  if (0x7ffffffe < *pBufLengthRequested) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x4d,"(*pBufLengthRequested <= MaxLength)",
                                "*pBufLengthRequested <= MaxLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  allocation._4_4_ = UInt32Math::AddMul<1u,2u>(*pcStack_18);
  size_t_newLength = Memory::HeapInfo::GetAlignedSize((ulong)allocation._4_4_);
  uStack_30 = (size_t_newLength >> 1) - 1;
  newChunk._4_4_ = (uint)uStack_30;
  if ((uStack_30 & 0xffffffff) != uStack_30) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x59,"(newLength == size_t_newLength)",
                                "newLength == size_t_newLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (0x7fffffff < newChunk._4_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x5a,"(newLength <= MaxLength + 1)","newLength <= MaxLength + 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (newChunk._4_4_ == 0x7fffffff) {
    newChunk._4_4_ = 0x7ffffffe;
  }
  if (0x7ffffffe < newChunk._4_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
                                ,0x61,"(newLength <= MaxLength)","newLength <= MaxLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pAVar4 = &this->alloc->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_68,(type_info *)&Data::typeinfo,size_t_newLength,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/StringBuilder.h"
             ,99);
  pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar4,&local_68);
  pDVar5 = (Data *)new<Memory::ArenaAllocator>(0x10,(ArenaAllocator *)pAVar4,0x3f67b0,0);
  *(undefined2 *)((long)&pDVar5->u + (ulong)newChunk._4_4_ * 2) = 0;
  *pcStack_18 = newChunk._4_4_;
  return pDVar5;
}

Assistant:

Data *NewSingleChunk(charcount_t *pBufLengthRequested)
        {
            Assert(*pBufLengthRequested <= MaxLength);

            // Let's just grow the current chunk in place

            CompileAssert(sizeof(charcount_t) == sizeof(uint32));

            //// allocation = (bufLengthRequested+1) * sizeof(char16)
            charcount_t alloc32 = UInt32Math::AddMul< 1, sizeof(char16) >(*pBufLengthRequested);

            size_t allocation = HeapInfo::GetAlignedSize(alloc32);
            size_t size_t_newLength  = allocation / sizeof(char16) - 1;
            charcount_t newLength = (charcount_t)size_t_newLength;
            Assert(newLength == size_t_newLength);
            Assert(newLength <= MaxLength + 1);
            if (newLength == MaxLength + 1)
            {
                // newLength could be MaxLength + 1 because of alignment.
                // In this case alloc size is 2 elements more than newLength (normally 1 elements more for NULL), that's fine.
                newLength = MaxLength;
            }
            Assert(newLength <= MaxLength);

            Data* newChunk = AllocatorNewStructPlus(TAllocator, this->alloc, allocation, Data);
            newChunk->u.single.buffer[newLength] = _u('\0');

            *pBufLengthRequested = newLength;
            return newChunk;
        }